

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  wostream *pwVar3;
  ulong *in_RSI;
  wostream *in_RDI;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  pwVar3 = std::operator<<(in_RDI,'(');
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,*in_RSI);
  pwVar3 = std::operator<<(pwVar3,' ');
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,in_RSI[1]);
  pwVar3 = std::operator<<(pwVar3,' ');
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,in_RSI[2]);
  pwVar3 = std::operator<<(pwVar3,' ');
  pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,in_RSI[3]);
  std::operator<<(pwVar3,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.r[0] << ' ' << S.r[1] << ' ' << S.r[2] << ' ' << S.r[3] << ')';
        out.flags(flags);
        return out;
      }